

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O0

string * duckdb::Exception::
         ConstructMessageRecursive<duckdb::LogicalType,duckdb::LogicalType,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                   (string *msg,
                   vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
                   *values,LogicalType *param,LogicalType *params,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_2,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_3)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  LogicalType *in_RSI;
  string *in_RDI;
  string *in_R9;
  string *in_stack_00000008;
  LogicalType *in_stack_00000010;
  value_type *in_stack_fffffffffffffe98;
  LogicalType *in_stack_fffffffffffffea0;
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [112];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  LogicalType *in_stack_ffffffffffffffb8;
  vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
  *in_stack_ffffffffffffffc0;
  string *in_stack_ffffffffffffffc8;
  
  LogicalType::LogicalType(in_stack_fffffffffffffea0,(LogicalType *)in_stack_fffffffffffffe98);
  ExceptionFormatValue::CreateFormatValue<duckdb::LogicalType>(in_stack_00000010);
  ::std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::
  push_back((vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
            in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  ExceptionFormatValue::~ExceptionFormatValue((ExceptionFormatValue *)0x1576809);
  LogicalType::~LogicalType((LogicalType *)0x1576816);
  LogicalType::LogicalType(in_RSI,(LogicalType *)in_stack_fffffffffffffe98);
  ::std::__cxx11::string::string(local_c8,in_R9);
  ::std::__cxx11::string::string(local_e8,in_stack_00000008);
  ::std::__cxx11::string::string(local_108,(string *)in_stack_00000010);
  ConstructMessageRecursive<duckdb::LogicalType,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
             in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_RCX);
  ::std::__cxx11::string::~string(local_108);
  ::std::__cxx11::string::~string(local_e8);
  ::std::__cxx11::string::~string(local_c8);
  LogicalType::~LogicalType((LogicalType *)0x15768e5);
  return in_RDI;
}

Assistant:

static string ConstructMessageRecursive(const string &msg, std::vector<ExceptionFormatValue> &values, T param,
	                                        ARGS... params) {
		values.push_back(ExceptionFormatValue::CreateFormatValue<T>(param));
		return ConstructMessageRecursive(msg, values, params...);
	}